

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

bool __thiscall ON_BinaryArchive::ReadArray(ON_BinaryArchive *this,ON_ClassArray<ON_String> *a)

{
  bool bVar1;
  bool bVar2;
  uint in_EAX;
  ON_String *s;
  int iVar3;
  int count;
  undefined8 uStack_28;
  
  uStack_28._0_4_ = in_EAX;
  ON_ClassArray<ON_String>::Empty(a);
  uStack_28 = (ulong)(uint)uStack_28;
  bVar2 = ReadInt32(this,1,(ON__INT32 *)((long)&uStack_28 + 4));
  if (0 < (int)uStack_28._4_4_ && bVar2) {
    ON_ClassArray<ON_String>::SetCapacity(a,(ulong)uStack_28._4_4_);
    if (bVar2 && 0 < (int)uStack_28._4_4_) {
      iVar3 = 1;
      do {
        s = ON_ClassArray<ON_String>::AppendNew(a);
        bVar2 = ReadString(this,s);
        if (!bVar2) {
          return bVar2;
        }
        bVar1 = iVar3 < (int)uStack_28._4_4_;
        iVar3 = iVar3 + 1;
      } while (bVar1);
    }
  }
  return bVar2;
}

Assistant:

bool 
ON_BinaryArchive::ReadArray( ON_ClassArray<ON_String>& a)
{
  a.Empty();
  int count = 0;
  bool rc = ReadInt( &count );
  if ( rc && count > 0 ) 
  {
    a.SetCapacity( count );
    int i;
    for ( i = 0; i < count && rc; i++ )
    {
      rc = ReadString( a.AppendNew() );
    }
  }
  return rc;
}